

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::promptWrite(Private *this,usize offset,String *clearStr)

{
  code *pcVar1;
  String *pSVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  byte *data;
  ulong size;
  ulong uVar8;
  usize i;
  ulong uVar9;
  usize len;
  ulong uVar10;
  Array<unsigned_int> buffer;
  String dataToWrite;
  Array<unsigned_int> wrappedBuffer;
  Array<unsigned_int> local_c8;
  String local_b0;
  Array<unsigned_int> local_88;
  String *local_68;
  long local_60;
  String local_58;
  
  uVar8 = this->stdoutScreenWidth;
  local_c8._capacity =
       ((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2) +
       clearStr->data->len + ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2);
  local_c8._begin.item = (uint *)0x0;
  local_c8._end.item = (uint *)0x0;
  Array<unsigned_int>::append(&local_c8,&this->prompt);
  Array<unsigned_int>::append(&local_c8,&this->input);
  uVar9 = clearStr->data->len;
  if (1 < uVar9) {
    iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                          ,0x19c,"clearStr.isEmpty() || clearStr.length() == 1");
    if (iVar5 != 0) goto LAB_00103fc9;
    uVar9 = clearStr->data->len;
  }
  if (uVar9 != 0) {
    pcVar6 = String::operator_cast_to_char_(clearStr);
    local_b0.data._0_4_ = (int)*pcVar6;
    Array<unsigned_int>::append(&local_c8,(uint *)&local_b0);
  }
  local_60 = offset + (offset / uVar8) * 2;
  uVar10 = (long)local_c8._end.item - (long)local_c8._begin.item >> 2;
  uVar8 = this->stdoutScreenWidth;
  local_88._capacity = uVar10 + (uVar10 / uVar8) * 2 + 2;
  local_88._begin.item = (uint *)0x0;
  local_88._end.item = (uint *)0x0;
  local_68 = clearStr;
  for (uVar9 = 0; lVar3 = local_60, uVar7 = uVar10 - uVar9, uVar9 <= uVar10 && uVar7 != 0;
      uVar9 = uVar9 + uVar8) {
    size = uVar8;
    if (uVar7 < uVar8) {
      size = uVar7;
    }
    Array<unsigned_int>::append(&local_88,local_c8._begin.item + uVar9,size);
    uVar8 = this->stdoutScreenWidth;
    if (size == uVar8) {
      local_b0.data._0_4_ = 0xd;
      Array<unsigned_int>::append(&local_88,(uint *)&local_b0);
      local_b0.data._0_4_ = 10;
      Array<unsigned_int>::append(&local_88,(uint *)&local_b0);
      uVar8 = this->stdoutScreenWidth;
    }
  }
  String::String(&local_b0,
                 ((long)local_88._end.item - (long)(local_88._begin.item + local_60) &
                 0xfffffffffffffffcU) + 10);
  local_58._data.ref = 0;
  local_58._data.str = "\x1b[?7l";
  local_58._data.len = 5;
  local_58.data = &local_58._data;
  String::append(&local_b0,&local_58);
  pSVar2 = local_68;
  String::~String(&local_58);
  bVar4 = Unicode::append(local_88._begin.item + lVar3,
                          ((long)local_88._end.item - (long)local_88._begin.item >> 2) - lVar3,
                          &local_b0);
  if (!bVar4) {
    iVar5 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                          ,0x1b1,
                          "Unicode::append((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset, dataToWrite)"
                         );
    if (iVar5 != 0) {
LAB_00103fc9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  local_58._data.ref = 0;
  local_58._data.str = "\x1b[?7h";
  local_58._data.len = 5;
  local_58.data = &local_58._data;
  String::append(&local_b0,&local_58);
  String::~String(&local_58);
  data = (byte *)String::operator_cast_to_char_(&local_b0);
  Buffer::append(&this->bufferedOutput,data,
                 *(usize *)(CONCAT44(local_b0.data._4_4_,(int)local_b0.data) + 8));
  uVar8 = ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) + pSVar2->data->len
  ;
  if (this->caretPos < uVar8) {
    moveCursorPosition(this,uVar8 + ((long)(this->prompt)._end.item -
                                     (long)(this->prompt)._begin.item >> 2),this->caretPos - uVar8);
  }
  String::~String(&local_b0);
  Array<unsigned_int>::~Array(&local_88);
  Array<unsigned_int>::~Array(&local_c8);
  return;
}

Assistant:

void promptWrite(usize offset = 0, const String& clearStr = String())
  {
    offset += offset / stdoutScreenWidth * 2;
    Array<conchar> buffer(prompt.size() + input.size() + clearStr.length());
    buffer.append(prompt);
    buffer.append(input);
    ASSERT(clearStr.isEmpty() || clearStr.length() == 1);
    if(!clearStr.isEmpty())
      buffer.append(*(const char*)clearStr);
    Array<conchar> wrappedBuffer(buffer.size() + buffer.size() / stdoutScreenWidth * 2 + 2);
    for(usize i = 0, len = buffer.size(); i < len; i += stdoutScreenWidth)
    {
      usize lineEnd = len - i;
      if(lineEnd > stdoutScreenWidth)
        lineEnd = stdoutScreenWidth;
      wrappedBuffer.append((const conchar*)buffer + i, lineEnd);
      if(lineEnd == stdoutScreenWidth)
      {
        wrappedBuffer.append('\r');
        wrappedBuffer.append('\n');
      }
    }
#ifdef _MSC_VER
    writeConsole((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset);
#else
    String dataToWrite((wrappedBuffer.size() - offset) * sizeof(uint32) + 10);
    dataToWrite.append("\x1b[?7l");
    VERIFY(Unicode::append((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset, dataToWrite));
    dataToWrite.append("\x1b[?7h");
    writeConsole(dataToWrite, dataToWrite.length());
#endif
    if(caretPos < input.size() + clearStr.length())
      moveCursorPosition(prompt.size() + input.size() + clearStr.length(), -(ssize)(input.size() + clearStr.length() - caretPos));
#ifdef _MSC_VER
    else // enforce cursor blink timer reset
      moveCursorPosition(prompt.size() + input.size() + clearStr.length(), 0);
#endif
  }